

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

void mcu8str_swap(mcu8str *str1,mcu8str *str2)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pcVar2 = str1->c_str;
  iVar1 = str1->owns_memory;
  str1->c_str = str2->c_str;
  uVar3 = str2->buflen;
  str2->c_str = pcVar2;
  uVar4 = str1->size;
  uVar5 = str1->buflen;
  str1->size = str2->size;
  str1->buflen = uVar3;
  str1->owns_memory = str2->owns_memory;
  str2->size = uVar4;
  str2->buflen = uVar5;
  str2->owns_memory = iVar1;
  return;
}

Assistant:

void mcu8str_swap( mcu8str* str1, mcu8str* str2 )
  {
    mcu8str tmp;
    tmp.c_str = str1->c_str;
    tmp.size = str1->size;
    tmp.buflen = str1->buflen;
    tmp.owns_memory = str1->owns_memory;
    str1->c_str = str2->c_str;
    str1->size = str2->size;
    str1->buflen = str2->buflen;
    str1->owns_memory = str2->owns_memory;
    str2->c_str = tmp.c_str;
    str2->size = tmp.size;
    str2->buflen = tmp.buflen;
    str2->owns_memory = tmp.owns_memory;
  }